

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_lib.c
# Opt level: O0

int OSSL_DECODER_CTX_add_extra(OSSL_DECODER_CTX *ctx,OSSL_LIB_CTX *libctx,char *propq)

{
  int iVar1;
  stack_st_OSSL_DECODER *psVar2;
  ulong uVar3;
  OSSL_DECODER *pOVar4;
  OSSL_DECODER_INSTANCE *decoder_inst_00;
  long in_RDI;
  OSSL_DECODER_INSTANCE *decoder_inst;
  size_t j;
  size_t i;
  BIO *trc_out;
  stack_st_OSSL_DECODER *skdecoders;
  size_t numdecoders;
  size_t count;
  size_t depth;
  collect_extra_decoder_data_st data;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  ulong uVar5;
  OSSL_DECODER *local_88;
  void *in_stack_ffffffffffffff90;
  _func_void_OSSL_DECODER_ptr_void_ptr *in_stack_ffffffffffffff98;
  OSSL_LIB_CTX *libctx_00;
  undefined1 local_58 [8];
  char *local_50;
  uint local_48;
  OSSL_DECODER *local_40;
  OSSL_DECODER *arg;
  OSSL_DECODER *decoder;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  libctx_00 = (OSSL_LIB_CTX *)0x0;
  if (in_RDI == 0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff70,iVar1,
                  (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    ERR_set_error(0x3c,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    local_4 = 1;
  }
  else {
    psVar2 = sk_OSSL_DECODER_new_null();
    if (psVar2 == (stack_st_OSSL_DECODER *)0x0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff70,iVar1,
                    (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      ERR_set_error(0x3c,0xc0100,(char *)0x0);
      local_4 = 0;
    }
    else {
      OSSL_DECODER_do_all_provided(libctx_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      iVar1 = sk_OSSL_DECODER_num((stack_st_OSSL_DECODER *)0x409f01);
      uVar3 = (ulong)iVar1;
      memset(local_58,0,0x38);
      local_40 = (OSSL_DECODER *)0x0;
      iVar1 = sk_OSSL_DECODER_INSTANCE_num((stack_st_OSSL_DECODER_INSTANCE *)0x409f40);
      pOVar4 = (OSSL_DECODER *)(long)iVar1;
      do {
        arg = pOVar4;
        decoder = pOVar4;
        for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
          for (local_88 = local_40; local_88 < arg;
              local_88 = (OSSL_DECODER *)((long)&(local_88->base).prov + 1)) {
            decoder_inst_00 =
                 sk_OSSL_DECODER_INSTANCE_value
                           ((stack_st_OSSL_DECODER_INSTANCE *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
            local_50 = OSSL_DECODER_INSTANCE_get_input_type(decoder_inst_00);
            for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
              sk_OSSL_DECODER_value
                        ((stack_st_OSSL_DECODER *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
              collect_extra_decoder(decoder,arg);
            }
          }
        }
        libctx_00 = (OSSL_LIB_CTX *)((long)&libctx_00->lock + 1);
        in_stack_ffffffffffffff67 = pOVar4 != decoder && libctx_00 < (OSSL_LIB_CTX *)0xb;
        local_40 = decoder;
      } while ((bool)in_stack_ffffffffffffff67);
      sk_OSSL_DECODER_pop_free
                ((stack_st_OSSL_DECODER *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (sk_OSSL_DECODER_freefunc)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int OSSL_DECODER_CTX_add_extra(OSSL_DECODER_CTX *ctx,
                               OSSL_LIB_CTX *libctx, const char *propq)
{
    /*
     * This function goes through existing decoder methods in
     * |ctx->decoder_insts|, and tries to fetch new decoders that produce
     * what the existing ones want as input, and push those newly fetched
     * decoders on top of the same stack.
     * Then it does the same again, but looping over the newly fetched
     * decoders, until there are no more decoders to be fetched, or
     * when we have done this 10 times.
     *
     * we do this with sliding windows on the stack by keeping track of indexes
     * and of the end.
     *
     * +----------------+
     * |   DER to RSA   | <--- w_prev_start
     * +----------------+
     * |   DER to DSA   |
     * +----------------+
     * |   DER to DH    |
     * +----------------+
     * |   PEM to DER   | <--- w_prev_end, w_new_start
     * +----------------+
     *                    <--- w_new_end
     */
    struct collect_extra_decoder_data_st data;
    size_t depth = 0; /* Counts the number of iterations */
    size_t count; /* Calculates how many were added in each iteration */
    size_t numdecoders;
    STACK_OF(OSSL_DECODER) *skdecoders;

    if (!ossl_assert(ctx != NULL)) {
        ERR_raise(ERR_LIB_OSSL_DECODER, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    /*
     * If there is no stack of OSSL_DECODER_INSTANCE, we have nothing
     * more to add.  That's fine.
     */
    if (ctx->decoder_insts == NULL)
        return 1;

    OSSL_TRACE_BEGIN(DECODER) {
        BIO_printf(trc_out, "(ctx %p) Looking for extra decoders\n",
                   (void *)ctx);
    } OSSL_TRACE_END(DECODER);


    skdecoders = sk_OSSL_DECODER_new_null();
    if (skdecoders == NULL) {
        ERR_raise(ERR_LIB_OSSL_DECODER, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    OSSL_DECODER_do_all_provided(libctx, collect_all_decoders, skdecoders);
    numdecoders = sk_OSSL_DECODER_num(skdecoders);

    memset(&data, 0, sizeof(data));
    data.ctx = ctx;
    data.w_prev_start = 0;
    data.w_prev_end = sk_OSSL_DECODER_INSTANCE_num(ctx->decoder_insts);
    do {
        size_t i, j;

        data.w_new_start = data.w_new_end = data.w_prev_end;

        /*
         * Two iterations:
         * 0.  All decoders that have the same name as their input type.
         *     This allows for decoders that unwrap some data in a specific
         *     encoding, and pass the result on with the same encoding.
         * 1.  All decoders that a different name than their input type.
         */
        for (data.type_check = IS_SAME;
             data.type_check <= IS_DIFFERENT;
             data.type_check++) {
            for (i = data.w_prev_start; i < data.w_prev_end; i++) {
                OSSL_DECODER_INSTANCE *decoder_inst =
                    sk_OSSL_DECODER_INSTANCE_value(ctx->decoder_insts, i);

                data.output_type
                    = OSSL_DECODER_INSTANCE_get_input_type(decoder_inst);


                for (j = 0; j < numdecoders; j++)
                    collect_extra_decoder(sk_OSSL_DECODER_value(skdecoders, j),
                                          &data);
            }
        }
        /* How many were added in this iteration */
        count = data.w_new_end - data.w_new_start;

        /* Slide the "previous decoder" windows */
        data.w_prev_start = data.w_new_start;
        data.w_prev_end = data.w_new_end;

        depth++;
    } while (count != 0 && depth <= 10);

    sk_OSSL_DECODER_pop_free(skdecoders, OSSL_DECODER_free);
    return 1;
}